

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eth_linux.c
# Opt level: O1

int csp_eth_init(char *device,char *ifname,int mtu,uint node_id,_Bool promisc,
                csp_iface_t **return_iface)

{
  csp_iface_t *ifc;
  int iVar1;
  char *pcVar2;
  int sockopt;
  ifreq if_mac;
  sockaddr_ll my_addr;
  
  pcVar2 = (char *)calloc(1,200);
  if (pcVar2 == (char *)0x0) {
    return -1;
  }
  strcpy(pcVar2,ifname);
  ifc = (csp_iface_t *)(pcVar2 + 0x10);
  *(char **)(pcVar2 + 0x18) = pcVar2;
  *(code **)(pcVar2 + 0x78) = csp_eth_tx_frame;
  *(uint8_t **)(pcVar2 + 0x80) = csp_eth_tx_buffer;
  *(code **)(pcVar2 + 0x30) = csp_eth_tx;
  *(short *)(pcVar2 + 0x10) = (short)node_id;
  *(char **)(pcVar2 + 0x28) = pcVar2;
  *(csp_iface_t **)(pcVar2 + 0x20) = ifc;
  pcVar2[0x70] = promisc;
  if (mtu < 0x18) {
    csp_print_func("csp_if_eth_init: mtu < 24\n");
  }
  else {
    iVar1 = socket(0x11,3,0xb588);
    *(int *)(pcVar2 + 0x98) = iVar1;
    if (iVar1 == -1) {
      csp_eth_init_cold_3();
    }
    else {
      pcVar2[0xb0] = '\0';
      pcVar2[0xb1] = '\0';
      pcVar2[0xb2] = '\0';
      pcVar2[0xb3] = '\0';
      pcVar2[0xb4] = '\0';
      pcVar2[0xb5] = '\0';
      pcVar2[0xb6] = '\0';
      pcVar2[0xb7] = '\0';
      pcVar2[0xb8] = '\0';
      pcVar2[0xb9] = '\0';
      pcVar2[0xba] = '\0';
      pcVar2[0xbb] = '\0';
      pcVar2[0xbc] = '\0';
      pcVar2[0xbd] = '\0';
      pcVar2[0xbe] = '\0';
      pcVar2[0xbf] = '\0';
      pcVar2[0xa0] = '\0';
      pcVar2[0xa1] = '\0';
      pcVar2[0xa2] = '\0';
      pcVar2[0xa3] = '\0';
      pcVar2[0xa4] = '\0';
      pcVar2[0xa5] = '\0';
      pcVar2[0xa6] = '\0';
      pcVar2[0xa7] = '\0';
      pcVar2[0xa8] = '\0';
      pcVar2[0xa9] = '\0';
      pcVar2[0xaa] = '\0';
      pcVar2[0xab] = '\0';
      pcVar2[0xac] = '\0';
      pcVar2[0xad] = '\0';
      pcVar2[0xae] = '\0';
      pcVar2[0xaf] = '\0';
      pcVar2[0xc0] = '\0';
      pcVar2[0xc1] = '\0';
      pcVar2[0xc2] = '\0';
      pcVar2[0xc3] = '\0';
      pcVar2[0xc4] = '\0';
      pcVar2[0xc5] = '\0';
      pcVar2[0xc6] = '\0';
      pcVar2[199] = '\0';
      strncpy(pcVar2 + 0xa0,device,0xf);
      iVar1 = ioctl(iVar1,0x8933,pcVar2 + 0xa0);
      if (iVar1 < 0) {
        pcVar2 = "SIOCGIFINDEX";
      }
      else {
        if_mac.ifr_ifru.ifru_map.mem_start = 0;
        if_mac.ifr_ifru.ifru_map.mem_end = 0;
        if_mac.ifr_ifrn._0_8_ = 0;
        if_mac.ifr_ifrn._8_8_ = 0;
        if_mac.ifr_ifru._16_8_ = 0;
        strncpy((char *)&if_mac,device,0xf);
        iVar1 = ioctl(*(int *)(pcVar2 + 0x98),0x8927,&if_mac);
        if (-1 < iVar1) {
          *(undefined2 *)(pcVar2 + 0x94) = if_mac.ifr_ifru.ifru_map.mem_start._6_2_;
          *(undefined4 *)(pcVar2 + 0x90) = if_mac.ifr_ifru.ifru_map.mem_start._2_4_;
          csp_print_func("INIT %s %s idx %d node %d mac %02hhx:%02hhx:%02hhx:%02hhx:%02hhx:%02hhx\n"
                         ,ifname,device,(ulong)*(uint *)(pcVar2 + 0xb0),(ulong)node_id,
                         if_mac.ifr_ifru.ifru_map.mem_start >> 0x10 & 0xff,
                         if_mac.ifr_ifru.ifru_map.mem_start >> 0x18 & 0xff,
                         if_mac.ifr_ifru.ifru_map.mem_start >> 0x20 & 0xff,
                         if_mac.ifr_ifru.ifru_map.mem_start >> 0x28 & 0xff,
                         if_mac.ifr_ifru.ifru_map.mem_start >> 0x30 & 0xff,
                         if_mac.ifr_ifru.ifru_map.mem_start >> 0x38);
          iVar1 = setsockopt(*(int *)(pcVar2 + 0x98),1,2,&sockopt,4);
          if (iVar1 == -1) {
            csp_eth_init_cold_2();
            return -2;
          }
          iVar1 = setsockopt(*(int *)(pcVar2 + 0x98),1,0x19,device,0xf);
          if (iVar1 == -1) {
            csp_eth_init_cold_1();
            return -2;
          }
          my_addr.sll_family = 0x11;
          my_addr.sll_protocol = 0xb588;
          my_addr.sll_ifindex = *(int *)(pcVar2 + 0xb0);
          bind(*(int *)(pcVar2 + 0x98),(sockaddr *)&my_addr,0x14);
          *(short *)(pcVar2 + 0x72) = (short)mtu;
          pthread_create(&csp_eth_init::server_handle,(pthread_attr_t *)0x0,csp_eth_rx_loop,pcVar2);
          csp_iflist_add(ifc);
          if (return_iface != (csp_iface_t **)0x0) {
            *return_iface = ifc;
            return 0;
          }
          return 0;
        }
        pcVar2 = "SIOCGIFHWADDR";
      }
      perror(pcVar2);
    }
  }
  return -2;
}

Assistant:

int csp_eth_init(const char * device, const char * ifname, int mtu, unsigned int node_id, bool promisc, csp_iface_t ** return_iface) {

	eth_context_t * ctx = calloc(1, sizeof(*ctx));
	if (ctx == NULL) {
		return CSP_ERR_NOMEM;
	}
	
	strcpy(ctx->name, ifname);
	ctx->ifdata.iface.name = ctx->name;
    ctx->ifdata.tx_func = &csp_eth_tx_frame;
    ctx->ifdata.tx_buf = (csp_eth_header_t*)&csp_eth_tx_buffer;
    ctx->ifdata.iface.nexthop = &csp_eth_tx,
	ctx->ifdata.iface.addr = node_id;
	ctx->ifdata.iface.driver_data = ctx;
    ctx->ifdata.iface.interface_data = &ctx->ifdata;
    ctx->ifdata.promisc = promisc;

    /* Ether header 14 byte, seg header 4 byte, CSP header 6 byte */
    if (mtu < 24) {
        csp_print("csp_if_eth_init: mtu < 24\n");
        return CSP_ERR_INVAL;
    }


    /**
     * TX SOCKET
     */

    /* Open RAW socket to send on */
    if ((ctx->sockfd = socket(AF_PACKET, SOCK_RAW, htobe16(CSP_ETH_TYPE_CSP))) == -1) {
        perror("socket");
        char exe[1024];
        int count = readlink("/proc/self/exe", exe, sizeof(exe));
        if (count > 0) {
            csp_print("Use command 'sudo setcap cap_net_raw+ep %s'\n", exe);
        }
        return CSP_ERR_INVAL;
    }

    /* Get the index of the interface to send on */
    memset(&ctx->if_idx, 0, sizeof(struct ifreq));
    strncpy(ctx->if_idx.ifr_name, device, IFNAMSIZ-1);
    if (ioctl(ctx->sockfd, SIOCGIFINDEX, &ctx->if_idx) < 0) {
        perror("SIOCGIFINDEX");
        return CSP_ERR_INVAL;
    }

    struct ifreq if_mac;
    /* Get the MAC address of the interface to send on */
    memset(&if_mac, 0, sizeof(struct ifreq));
    strncpy(if_mac.ifr_name, device, IFNAMSIZ-1);
    if (ioctl(ctx->sockfd, SIOCGIFHWADDR, &if_mac) < 0) {
        perror("SIOCGIFHWADDR");
        return CSP_ERR_INVAL;
    }

    memcpy(&ctx->ifdata.if_mac, if_mac.ifr_hwaddr.sa_data, sizeof(ctx->ifdata.if_mac));

    csp_print("INIT %s %s idx %d node %d mac %02hhx:%02hhx:%02hhx:%02hhx:%02hhx:%02hhx\n", 
        ifname, device, ctx->if_idx.ifr_ifindex, node_id,
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[0],
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[1],
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[2],
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[3],
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[4],
        ((uint8_t *)if_mac.ifr_hwaddr.sa_data)[5]);

    /* Allow the socket to be reused - incase connection is closed prematurely */
    int sockopt;
    if (setsockopt(ctx->sockfd, SOL_SOCKET, SO_REUSEADDR, &sockopt, sizeof sockopt) == -1) {
        perror("setsockopt");
        close(ctx->sockfd);
        return CSP_ERR_INVAL;
    }

    /* Bind to device */
    if (setsockopt(ctx->sockfd, SOL_SOCKET, SO_BINDTODEVICE, device, IFNAMSIZ-1) == -1)	{
        perror("SO_BINDTODEVICE");
        close(ctx->sockfd);
        return CSP_ERR_INVAL;
    }

    /* fill sockaddr_ll struct to prepare binding */
    struct sockaddr_ll my_addr;
    my_addr.sll_family = AF_PACKET;
    my_addr.sll_protocol = htobe16(CSP_ETH_TYPE_CSP);
    my_addr.sll_ifindex = ctx->if_idx.ifr_ifindex;

    /* bind socket  */
    bind(ctx->sockfd, (struct sockaddr *)&my_addr, sizeof(struct sockaddr_ll));

    ctx->ifdata.tx_mtu = mtu;

    /* Start server thread */
    static pthread_t server_handle;
    pthread_create(&server_handle, NULL, &csp_eth_rx_loop, ctx);

    /**
     * CSP INTERFACE
     */

    /* Register interface */
    csp_iflist_add(&ctx->ifdata.iface);

	if (return_iface) {
		*return_iface = &ctx->ifdata.iface;
	}

    return CSP_ERR_NONE;}